

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::SetBox(Element *this,Box *box)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  float value;
  float fVar4;
  double dVar5;
  String local_78;
  float local_58;
  BoxEdge local_54;
  float border_width;
  BoxEdge edge;
  const_iterator __end2;
  const_iterator __begin2;
  undefined4 local_38;
  undefined4 local_34;
  initializer_list<Rml::BoxEdge> local_30;
  initializer_list<Rml::BoxEdge> *local_20;
  initializer_list<Rml::BoxEdge> *__range2;
  Box *box_local;
  Element *this_local;
  
  __range2 = (initializer_list<Rml::BoxEdge> *)box;
  box_local = (Box *)this;
  bVar1 = Box::operator!=(box,&this->main_box);
  if ((bVar1) ||
     (sVar2 = ::std::
              vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::
              size(&this->additional_boxes), sVar2 != 0)) {
    __begin2._0_4_ = 0;
    __begin2._4_4_ = 1;
    local_38 = 2;
    local_34 = 3;
    local_30._M_array = (iterator)&__begin2;
    local_30._M_len = 4;
    local_20 = &local_30;
    __end2 = ::std::initializer_list<Rml::BoxEdge>::begin(local_20);
    _border_width = ::std::initializer_list<Rml::BoxEdge>::end(local_20);
    for (; __end2 != _border_width; __end2 = __end2 + 1) {
      local_54 = *__end2;
      value = Box::GetEdge((Box *)__range2,Border,local_54);
      local_58 = value;
      fVar4 = Math::Round(value);
      if ((value != fVar4) || (NAN(value) || NAN(fVar4))) {
        dVar5 = (double)local_58;
        GetAddress_abi_cxx11_(&local_78,this,false,true);
        uVar3 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Expected integer border width but got %g px on element: %s",dVar5,
                     uVar3);
        ::std::__cxx11::string::~string((string *)&local_78);
      }
    }
    memcpy(&this->main_box,__range2,0x38);
    ::std::vector<Rml::Element::PositionedBox,_std::allocator<Rml::Element::PositionedBox>_>::clear
              (&this->additional_boxes);
    (*(this->super_ScriptInterface).super_Releasable._vptr_Releasable[0xc])();
    this->field_0x17 = this->field_0x17 & 0xfe | 1;
    ElementBackgroundBorder::DirtyBackground(&this->meta->background_border);
    ElementBackgroundBorder::DirtyBorder(&this->meta->background_border);
    ElementEffects::DirtyEffectsData(&this->meta->effects);
  }
  return;
}

Assistant:

void Element::SetBox(const Box& box)
{
	if (box != main_box || additional_boxes.size() > 0)
	{
#ifdef RMLUI_DEBUG
		for (const BoxEdge edge : {BoxEdge::Top, BoxEdge::Right, BoxEdge::Bottom, BoxEdge::Left})
		{
			const float border_width = box.GetEdge(BoxArea::Border, edge);
			if (border_width != Math::Round(border_width))
				Log::Message(Log::LT_WARNING, "Expected integer border width but got %g px on element: %s", border_width, GetAddress().c_str());
		}
#endif

		main_box = box;
		additional_boxes.clear();

		OnResize();
		rounded_main_padding_size_dirty = true;
		meta->background_border.DirtyBackground();
		meta->background_border.DirtyBorder();
		meta->effects.DirtyEffectsData();
	}
}